

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_to_zero_test(bool multi_kv)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  long extraout_RDX;
  uint uVar8;
  code *pcVar9;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *ptr_handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig_00;
  timeval *ptVar10;
  timeval *__tv;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar11;
  long lVar12;
  char *__s;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar15;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar16;
  undefined7 in_register_00000039;
  fdb_kvs_handle *pfVar17;
  fdb_file_handle *pfVar18;
  fdb_kvs_config *pfVar19;
  fdb_kvs_handle **ppfVar20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R13;
  ulong uVar21;
  btree *doc;
  char cVar22;
  long lVar23;
  char *pcVar24;
  fdb_kvs_config *config;
  char *pcVar25;
  uint *puVar26;
  fdb_config *fconfig_02;
  fdb_kvs_handle **ppfVar27;
  char *pcVar28;
  fdb_doc *doc_00;
  fdb_doc *pfVar29;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_01;
  fdb_kvs_handle *pfVar30;
  fdb_file_handle *dbfile;
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_4f80;
  fdb_kvs_handle *pfStack_4f78;
  fdb_file_handle *pfStack_4f70;
  fdb_iterator *pfStack_4f68;
  fdb_doc *pfStack_4f60;
  fdb_kvs_handle *pfStack_4f58;
  timeval tStack_4f50;
  fdb_kvs_config fStack_4f40;
  fdb_config fStack_4f28;
  fdb_config *pfStack_4e30;
  fdb_kvs_handle *pfStack_4e28;
  fdb_kvs_handle *pfStack_4e20;
  fdb_file_handle *pfStack_4e18;
  fdb_kvs_handle *pfStack_4e10;
  char acStack_4e07 [15];
  filemgr *pfStack_4df8;
  docio_handle *pdStack_4df0;
  btreeblk_handle *pbStack_4de8;
  size_t sStack_4de0;
  filemgr *pfStack_4dd8;
  docio_handle *pdStack_4dd0;
  btreeblk_handle *pbStack_4dc8;
  timeval tStack_4dc0;
  undefined1 auStack_4db0 [76];
  uint uStack_4d64;
  char *pcStack_4c70;
  atomic<unsigned_long> aStack_4c68;
  btree *pbStack_4c60;
  fdb_kvs_handle *pfStack_4c58;
  fdb_kvs_handle *pfStack_4c50;
  code *pcStack_4c48;
  uint uStack_4c34;
  fdb_txn *pfStack_4c30;
  fdb_kvs_handle *pfStack_4c28;
  fdb_iterator *pfStack_4c20;
  fdb_snapshot_info_t *pfStack_4c18;
  int iStack_4c0c;
  fdb_kvs_handle *pfStack_4c08;
  fdb_kvs_handle *apfStack_4c00 [3];
  uint64_t uStack_4be8;
  fdb_kvs_config fStack_4be0;
  char acStack_4bc8 [8];
  timeval tStack_4bc0;
  char acStack_4bb0 [256];
  btree bStack_4ab0;
  char acStack_4a60 [256];
  char acStack_4960 [256];
  fdb_config fStack_4860;
  fdb_kvs_handle **ppfStack_4768;
  fdb_kvs_handle **ppfStack_4760;
  fdb_kvs_handle *pfStack_4758;
  fdb_kvs_handle **ppfStack_4750;
  fdb_kvs_handle *pfStack_4748;
  code *pcStack_4740;
  fdb_kvs_handle **ppfStack_4738;
  fdb_kvs_handle *pfStack_4730;
  fdb_kvs_handle *apfStack_4728 [9];
  fdb_kvs_config fStack_46e0;
  timeval tStack_46c8;
  fdb_kvs_handle *apfStack_46b8 [33];
  fdb_config fStack_45b0;
  fdb_kvs_handle *apfStack_44b8 [32];
  fdb_kvs_handle *apfStack_43b8 [32];
  fdb_kvs_handle afStack_42b8 [15];
  fdb_config *pfStack_22b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a0;
  fdb_config *pfStack_2298;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2290;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2288;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2278;
  fdb_file_handle *pfStack_2270;
  fdb_iterator *pfStack_2268;
  fdb_doc *pfStack_2260;
  fdb_kvs_handle *pfStack_2258;
  undefined1 auStack_224f [15];
  timeval tStack_2240;
  undefined1 auStack_2230 [72];
  fdb_config fStack_21e8;
  timeval *ptStack_20f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20e8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20e0;
  fdb_config *pfStack_20d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20d0;
  int iStack_20bc;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20b8;
  fdb_file_handle *pfStack_20b0;
  pthread_t pStack_20a8;
  char acStack_209f [15];
  void *pvStack_2090;
  char *pcStack_2088;
  fdb_config *pfStack_2080;
  uint64_t uStack_2078;
  timeval tStack_2070;
  undefined1 auStack_2060 [16];
  uint64_t uStack_2050;
  fdb_config fStack_1f68;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e68;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e60;
  uint *puStack_1e58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e48;
  timeval tStack_1e38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e10;
  fdb_kvs_handle *pfStack_1e08;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e00;
  fdb_file_handle *pfStack_1df8;
  uint uStack_1dec;
  fdb_kvs_config afStack_1de8 [2];
  timeval tStack_1da8;
  fdb_kvs_config fStack_1d98;
  fdb_kvs_info fStack_1d78;
  undefined1 auStack_1d48 [32];
  undefined1 uStack_1d28;
  undefined1 uStack_1d1a;
  undefined8 uStack_1d10;
  code *pcStack_1cf0;
  undefined4 uStack_1ce8;
  uint *puStack_1ce0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c48;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c40;
  hbtrie_func_readkey *phStack_1c38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c28;
  fdb_file_handle *pfStack_1c18;
  uint uStack_1c0c;
  fdb_kvs_handle *pfStack_1c08;
  fdb_kvs_handle *pfStack_1c00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1bf8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1bf0 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1bc8;
  char acStack_1bc0 [8];
  fdb_kvs_config fStack_1bb8;
  fdb_kvs_info fStack_1ba0;
  timeval tStack_1b70;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1b60 [5];
  btree *apbStack_1b38 [5];
  btree *apbStack_1b10 [5];
  btree *apbStack_1ae8 [4];
  fdb_doc *pfStack_1ac8;
  char acStack_1ac0 [256];
  char acStack_19c0 [256];
  char acStack_18c0 [256];
  fdb_config fStack_17c0;
  fdb_doc *pfStack_16c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16b8;
  fdb_kvs_config *pfStack_16b0;
  fdb_doc *pfStack_16a8;
  code *pcStack_16a0;
  undefined1 auStack_1688 [36];
  undefined4 uStack_1664;
  fdb_kvs_handle *pfStack_1660;
  fdb_doc **ppfStack_1658;
  timeval tStack_1650;
  fdb_kvs_config fStack_1640;
  fdb_doc afStack_1628 [3];
  char acStack_1528 [256];
  char acStack_1428 [264];
  fdb_config fStack_1320;
  fdb_doc *pfStack_1228;
  size_t *psStack_1220;
  fdb_doc afStack_d78 [15];
  fdb_kvs_handle *pfStack_8c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8b0;
  char *pcStack_8a8;
  char *pcStack_8a0;
  code *pcStack_898;
  fdb_kvs_handle *pfStack_888;
  int iStack_87c;
  fdb_kvs_handle *pfStack_878;
  undefined1 auStack_870 [232];
  char acStack_788 [8];
  char acStack_780 [64];
  timeval tStack_740;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_730 [5];
  btree *apbStack_708 [5];
  btree *apbStack_6e0 [5];
  btree *apbStack_6b8 [5];
  fdb_config fStack_690;
  fdb_kvs_info *pfStack_598;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_590;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_588;
  fdb_kvs_handle **ppfStack_580;
  fdb_kvs_handle **ppfStack_578;
  code *pcStack_570;
  fdb_file_handle *local_558;
  uint local_54c;
  fdb_kvs_handle *local_548 [4];
  fdb_kvs_info local_528;
  fdb_kvs_config local_4f8;
  char local_4e0 [8];
  timeval local_4d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_4c8 [5];
  btree *local_4a0 [5];
  btree *local_478 [5];
  btree *local_450 [5];
  char local_428 [256];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pcStack_570 = (code *)0x119ca2;
  gettimeofday((timeval *)(local_4e0 + 8),(__timezone_ptr_t)0x0);
  pcStack_570 = (code *)0x119ca7;
  memleak_start();
  pcStack_570 = (code *)0x119cb3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_570 = (code *)0x119cc3;
  fdb_get_default_config();
  pcStack_570 = (code *)0x119ccd;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  pcStack_570 = (code *)0x119d00;
  local_128.multi_kv_instances = multi_kv;
  fdb_open(&local_558,"./mvcc_test1",&local_128);
  local_54c = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_54c == 0) {
    pcStack_570 = (code *)0x119d6f;
    fdb_kvs_open_default(local_558,local_548,&local_4f8);
    lVar12 = 1;
  }
  else {
    ppfVar11 = local_548;
    unaff_R12.seqtree = (btree *)&local_4f8;
    uVar21 = 0;
    do {
      pcStack_570 = (code *)0x119d34;
      sprintf(local_4e0,"kv%d",uVar21 & 0xffffffff);
      pcStack_570 = (code *)0x119d47;
      fdb_kvs_open(local_558,ppfVar11,local_4e0,(fdb_kvs_config *)unaff_R12.seqtree);
      uVar21 = uVar21 + 1;
      ppfVar11 = ppfVar11 + 1;
    } while (uVar21 != 4);
    lVar12 = 4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar11 = (fdb_kvs_handle **)0x0;
  pcVar9 = logCallbackFunc;
  pcVar28 = "rollback_to_zero_test";
  do {
    pfVar17 = local_548[(long)ppfVar11];
    pcStack_570 = (code *)0x119d95;
    fVar2 = fdb_set_log_callback(pfVar17,logCallbackFunc,"rollback_to_zero_test");
    iVar3 = (int)pfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_570 = (code *)0x11a31e;
      rollback_to_zero_test();
      goto LAB_0011a31e;
    }
    ppfVar11 = (fdb_kvs_handle **)((long)ppfVar11 + 1);
  } while ((fdb_kvs_handle **)lVar12 != ppfVar11);
  uVar21 = 0;
  do {
    pcStack_570 = (code *)0x119dc4;
    sprintf(local_328,"key%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119de0;
    sprintf(local_428,"meta%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119dfc;
    sprintf(local_228,"body%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119e0f;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x119e1a;
    sVar6 = strlen(local_428);
    pcStack_570 = (code *)0x119e25;
    sVar7 = strlen(local_228);
    pcStack_570 = (code *)0x119e4a;
    fdb_doc_create((fdb_doc **)&local_4c8[uVar21].seqtree,local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar23 = 0;
    do {
      pcStack_570 = (code *)0x119e5a;
      fdb_set(local_548[lVar23],(fdb_doc *)local_4c8[uVar21].seqtree);
      lVar23 = lVar23 + 1;
    } while (lVar12 != lVar23);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 5);
  pcStack_570 = (code *)0x119e7e;
  fdb_commit(local_558,'\x01');
  uVar21 = 5;
  do {
    pcStack_570 = (code *)0x119ea0;
    sprintf(local_328,"key%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119ebc;
    sprintf(local_428,"meta%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119ed8;
    sprintf(local_228,"body%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119eeb;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x119ef6;
    sVar6 = strlen(local_428);
    pcStack_570 = (code *)0x119f01;
    sVar7 = strlen(local_228);
    pcStack_570 = (code *)0x119f26;
    fdb_doc_create((fdb_doc **)&local_4c8[uVar21].seqtree,local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar23 = 0;
    do {
      pcStack_570 = (code *)0x119f37;
      fdb_set(local_548[lVar23],(fdb_doc *)local_4c8[uVar21].seqtree);
      lVar23 = lVar23 + 1;
    } while (lVar12 != lVar23);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  pcStack_570 = (code *)0x119f58;
  fdb_commit(local_558,'\0');
  uVar21 = 10;
  do {
    pcStack_570 = (code *)0x119f7a;
    sprintf(local_328,"key%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119f96;
    sprintf(local_428,"meta%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119fb2;
    sprintf(local_228,"body%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x119fc5;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x119fd0;
    sVar6 = strlen(local_428);
    pcStack_570 = (code *)0x119fdb;
    sVar7 = strlen(local_228);
    pcStack_570 = (code *)0x11a000;
    fdb_doc_create((fdb_doc **)&local_4c8[uVar21].seqtree,local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar23 = 0;
    do {
      pcStack_570 = (code *)0x11a011;
      fdb_set(local_548[lVar23],(fdb_doc *)local_4c8[uVar21].seqtree);
      lVar23 = lVar23 + 1;
    } while (lVar12 != lVar23);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0xf);
  pcStack_570 = (code *)0x11a035;
  fdb_commit(local_558,'\x01');
  uVar21 = 0xf;
  do {
    pcStack_570 = (code *)0x11a057;
    sprintf(local_328,"key%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x11a073;
    sprintf(local_428,"meta%d",uVar21 & 0xffffffff);
    pcStack_570 = (code *)0x11a08f;
    sprintf(local_228,"body%d",uVar21 & 0xffffffff);
    unaff_R12.seqtree = (btree *)(local_4c8 + uVar21);
    pcStack_570 = (code *)0x11a0a2;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x11a0ad;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(local_428);
    pcStack_570 = (code *)0x11a0b8;
    sVar6 = strlen(local_228);
    pcStack_570 = (code *)0x11a0dd;
    fdb_doc_create((fdb_doc **)unaff_R12.seqtree,local_328,sVar5,local_428,(size_t)unaff_R13,
                   local_228,sVar6);
    ppfVar11 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_570 = (code *)0x11a0ee;
      fdb_set(local_548[(long)ppfVar11],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R12.seqtree)->ksize)->
              seqtree);
      ppfVar11 = (fdb_kvs_handle **)((long)ppfVar11 + 1);
    } while ((fdb_kvs_handle **)lVar12 != ppfVar11);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0x14);
  pcStack_570 = (code *)0x11a10f;
  fdb_commit(local_558,'\0');
  pcVar9 = (code *)(ulong)local_54c;
  if ((char)local_54c != '\0') {
    unaff_R12.seqtree = (btree *)&local_528.doc_count;
    unaff_R13.seqtree = (btree *)&local_528.space_used;
    pcVar9 = (code *)(local_548 + 4);
    pcVar28 = (char *)local_548;
    do {
      ppfVar11 = (fdb_kvs_handle **)pcVar28;
      pcStack_570 = (code *)0x11a13c;
      ppfVar27 = ppfVar11;
      fVar2 = fdb_rollback(ppfVar11,0);
      iVar3 = (int)ppfVar27;
      pcVar28 = (char *)ppfVar11;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a323;
      pfVar17 = *ppfVar11;
      pcStack_570 = (code *)0x11a152;
      fVar2 = fdb_get_kvs_info(pfVar17,(fdb_kvs_info *)pcVar9);
      iVar3 = (int)pfVar17;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a31e;
      if (local_528.last_seqnum != 0) {
        pcStack_570 = (code *)0x11a1bb;
        rollback_to_zero_test();
      }
      if (local_528.doc_count != 0) {
        pcStack_570 = (code *)0x11a1c5;
        rollback_to_zero_test();
      }
      if (local_528.space_used != 0) {
        pcStack_570 = (code *)0x11a1cf;
        rollback_to_zero_test();
      }
      pfVar17 = *ppfVar11;
      pcStack_570 = (code *)0x11a182;
      fVar2 = fdb_get(pfVar17,(fdb_doc *)local_4c8[0].seqtree);
      iVar3 = (int)pfVar17;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a32d;
      pfVar17 = *ppfVar11;
      pcStack_570 = (code *)0x11a19b;
      fVar2 = fdb_set(pfVar17,(fdb_doc *)local_4c8[0].seqtree);
      iVar3 = (int)pfVar17;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a328;
      pcVar28 = (char *)(ppfVar11 + 1);
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
LAB_0011a267:
    pcStack_570 = (code *)0x11a276;
    pfVar18 = local_558;
    fVar2 = fdb_commit(local_558,'\x01');
    iVar3 = (int)pfVar18;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_570 = (code *)0x11a288;
      fdb_close(local_558);
      lVar12 = 0;
      do {
        pcStack_570 = (code *)0x11a297;
        fdb_doc_free((fdb_doc *)local_4c8[lVar12].seqtree);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x14);
      pcStack_570 = (code *)0x11a2a5;
      fdb_shutdown();
      pcStack_570 = (code *)0x11a2aa;
      memleak_end();
      pcVar28 = "single kv mode:";
      if ((char)local_54c != '\0') {
        pcVar28 = "multiple kv mode:";
      }
      pcStack_570 = (code *)0x11a2da;
      sprintf(local_228,"rollback to zero test %s",pcVar28);
      pcVar28 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      pcStack_570 = (code *)0x11a307;
      fprintf(_stderr,pcVar28,local_228);
      return;
    }
    goto LAB_0011a332;
  }
  ppfVar27 = local_548;
  pcStack_570 = (code *)0x11a1dd;
  fVar2 = fdb_rollback(ppfVar27,0);
  iVar3 = (int)ppfVar27;
  pcVar28 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a337;
  pcStack_570 = (code *)0x11a1f4;
  pfVar17 = local_548[0];
  fVar2 = fdb_get_kvs_info(local_548[0],(fdb_kvs_info *)(local_548 + 4));
  iVar3 = (int)pfVar17;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a33c;
  if (local_528.last_seqnum != 0) {
    pcStack_570 = (code *)0x11a20e;
    rollback_to_zero_test();
  }
  if (local_528.doc_count != 0) {
    pcStack_570 = (code *)0x11a220;
    rollback_to_zero_test();
  }
  if (local_528.space_used != 0) {
    pcStack_570 = (code *)0x11a232;
    rollback_to_zero_test();
  }
  pcStack_570 = (code *)0x11a244;
  pfVar17 = local_548[0];
  fVar2 = fdb_get(local_548[0],(fdb_doc *)local_4c8[0].seqtree);
  iVar3 = (int)pfVar17;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a341;
  pcStack_570 = (code *)0x11a25f;
  fVar2 = fdb_set(local_548[0],(fdb_doc *)local_4c8[0].seqtree);
  iVar3 = (int)local_548[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a267;
  goto LAB_0011a346;
LAB_0011a977:
  pcStack_898 = (code *)0x11a97c;
  rollback_to_zero_after_compact_test();
LAB_0011a97c:
  pcStack_898 = (code *)0x11a981;
  rollback_to_zero_after_compact_test();
LAB_0011a981:
  pcStack_898 = (code *)0x11a986;
  rollback_to_zero_after_compact_test();
LAB_0011a986:
  pcStack_898 = (code *)0x11a98b;
  rollback_to_zero_after_compact_test();
  goto LAB_0011a98b;
LAB_0011b672:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b677;
  rollback_all_test();
LAB_0011b677:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b684;
  rollback_all_test();
  aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
LAB_0011b684:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b689;
  rollback_all_test();
LAB_0011b689:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b693;
  rollback_all_test();
LAB_0011b693:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b698;
  rollback_all_test();
  goto LAB_0011b698;
LAB_0011be65:
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_4740 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_4740 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_4740 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_4740 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_4740 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_4740 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_4740 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_4c48 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_4e20 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_4e20 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011a31e:
  pcStack_570 = (code *)0x11a323;
  rollback_to_zero_test();
LAB_0011a323:
  pcStack_570 = (code *)0x11a328;
  rollback_to_zero_test();
LAB_0011a328:
  pcStack_570 = (code *)0x11a32d;
  rollback_to_zero_test();
LAB_0011a32d:
  pcStack_570 = (code *)0x11a332;
  rollback_to_zero_test();
LAB_0011a332:
  pcStack_570 = (code *)0x11a337;
  rollback_to_zero_test();
LAB_0011a337:
  pcStack_570 = (code *)0x11a33c;
  rollback_to_zero_test();
LAB_0011a33c:
  pcStack_570 = (code *)0x11a341;
  rollback_to_zero_test();
LAB_0011a341:
  pcStack_570 = (code *)0x11a346;
  rollback_to_zero_test();
LAB_0011a346:
  pcStack_570 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_898 = (code *)0x11a36d;
  pfStack_598 = (fdb_kvs_info *)pcVar9;
  aStack_590 = unaff_R12;
  aStack_588 = unaff_R13;
  ppfStack_580 = ppfVar11;
  ppfStack_578 = (fdb_kvs_handle **)pcVar28;
  pcStack_570 = (code *)lVar12;
  gettimeofday(&tStack_740,(__timezone_ptr_t)0x0);
  pcStack_898 = (code *)0x11a379;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_898 = (code *)0x11a389;
  fdb_get_default_config();
  pcStack_898 = (code *)0x11a396;
  fdb_get_default_kvs_config();
  fStack_690.buffercache_size = 0;
  fStack_690.wal_threshold = 0x400;
  fStack_690.flags = 1;
  fStack_690.compaction_threshold = '\0';
  pcStack_898 = (code *)0x11a3c9;
  fStack_690.multi_kv_instances = (bool)(char)iVar3;
  fdb_open((fdb_file_handle **)&pfStack_888,"./mvcc_test1",&fStack_690);
  iStack_87c = iVar3;
  if (iVar3 == 0) {
    pcStack_898 = (code *)0x11a43e;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_888,(fdb_kvs_handle **)auStack_870,
               (fdb_kvs_config *)(auStack_870 + 0xd0));
    pcVar28 = (char *)0x1;
  }
  else {
    ppfVar11 = (fdb_kvs_handle **)auStack_870;
    unaff_R12.seqtree = (btree *)(auStack_870 + 0xd0);
    uVar21 = 0;
    do {
      pcStack_898 = (code *)0x11a400;
      sprintf(acStack_788,"kv%d",uVar21 & 0xffffffff);
      pcStack_898 = (code *)0x11a413;
      fdb_kvs_open((fdb_file_handle *)pfStack_888,ppfVar11,acStack_788,
                   (fdb_kvs_config *)unaff_R12.seqtree);
      uVar21 = uVar21 + 1;
      ppfVar11 = ppfVar11 + 1;
    } while (uVar21 != 4);
    pcVar28 = (char *)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar25 = (char *)0x0;
  pcVar9 = logCallbackFunc;
  pcVar24 = "rollback_to_zero_after_compact_test";
  do {
    pfVar17 = *(fdb_kvs_handle **)(auStack_870 + (long)pcVar25 * 8);
    pcStack_898 = (code *)0x11a464;
    fVar2 = fdb_set_log_callback(pfVar17,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_898 = (code *)0x11a977;
      rollback_to_zero_after_compact_test();
      goto LAB_0011a977;
    }
    pcVar25 = pcVar25 + 1;
  } while (pcVar28 != pcVar25);
  uVar21 = 0;
  do {
    pcStack_898 = (code *)0x11a493;
    sprintf(auStack_870 + 0x90,"key%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a4a9;
    sprintf(auStack_870 + 0x50,"meta%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a4c2;
    sprintf(acStack_780,"body%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a4d5;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a4e5;
    sVar6 = strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a4f5;
    sVar7 = strlen(acStack_780);
    pcStack_898 = (code *)0x11a51a;
    fdb_doc_create((fdb_doc **)&aaStack_730[uVar21].seqtree,auStack_870 + 0x90,sVar5,
                   auStack_870 + 0x50,sVar6,acStack_780,sVar7);
    lVar12 = 0;
    do {
      pcStack_898 = (code *)0x11a52b;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + lVar12 * 8),(fdb_doc *)aaStack_730[uVar21].seqtree)
      ;
      lVar12 = lVar12 + 1;
    } while (pcVar28 != (char *)lVar12);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 5);
  pcStack_898 = (code *)0x11a54f;
  fdb_commit((fdb_file_handle *)pfStack_888,'\x01');
  uVar21 = 5;
  do {
    pcStack_898 = (code *)0x11a571;
    sprintf(auStack_870 + 0x90,"key%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a58a;
    sprintf(auStack_870 + 0x50,"meta%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a5a6;
    sprintf(acStack_780,"body%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a5b9;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a5c4;
    sVar6 = strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a5cf;
    sVar7 = strlen(acStack_780);
    pcStack_898 = (code *)0x11a5f1;
    fdb_doc_create((fdb_doc **)&aaStack_730[uVar21].seqtree,auStack_870 + 0x90,sVar5,
                   auStack_870 + 0x50,sVar6,acStack_780,sVar7);
    lVar12 = 0;
    do {
      pcStack_898 = (code *)0x11a601;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + lVar12 * 8),(fdb_doc *)aaStack_730[uVar21].seqtree)
      ;
      lVar12 = lVar12 + 1;
    } while (pcVar28 != (char *)lVar12);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  pcStack_898 = (code *)0x11a622;
  fdb_commit((fdb_file_handle *)pfStack_888,'\0');
  uVar21 = 10;
  do {
    pcStack_898 = (code *)0x11a644;
    sprintf(auStack_870 + 0x90,"key%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a65d;
    sprintf(auStack_870 + 0x50,"meta%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a679;
    sprintf(acStack_780,"body%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a68c;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a697;
    sVar6 = strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a6a2;
    sVar7 = strlen(acStack_780);
    pcStack_898 = (code *)0x11a6c4;
    fdb_doc_create((fdb_doc **)&aaStack_730[uVar21].seqtree,auStack_870 + 0x90,sVar5,
                   auStack_870 + 0x50,sVar6,acStack_780,sVar7);
    lVar12 = 0;
    do {
      pcStack_898 = (code *)0x11a6d4;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + lVar12 * 8),(fdb_doc *)aaStack_730[uVar21].seqtree)
      ;
      lVar12 = lVar12 + 1;
    } while (pcVar28 != (char *)lVar12);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0xf);
  pcStack_898 = (code *)0x11a6f8;
  fdb_commit((fdb_file_handle *)pfStack_888,'\x01');
  uVar21 = 0xf;
  do {
    pcStack_898 = (code *)0x11a71a;
    sprintf(auStack_870 + 0x90,"key%d",uVar21 & 0xffffffff);
    pcStack_898 = (code *)0x11a733;
    sprintf(auStack_870 + 0x50,"meta%d",uVar21 & 0xffffffff);
    pcVar25 = acStack_780;
    pcStack_898 = (code *)0x11a74f;
    sprintf(pcVar25,"body%d",uVar21 & 0xffffffff);
    unaff_R13.seqtree = (btree *)(aaStack_730 + uVar21);
    pcStack_898 = (code *)0x11a762;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a76d;
    unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a778;
    sVar6 = strlen(pcVar25);
    pcStack_898 = (code *)0x11a79a;
    fdb_doc_create((fdb_doc **)unaff_R13.seqtree,auStack_870 + 0x90,sVar5,auStack_870 + 0x50,
                   (size_t)unaff_R12,pcVar25,sVar6);
    pcVar9 = (code *)0x0;
    do {
      pcStack_898 = (code *)0x11a7aa;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + (long)pcVar9 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R13.seqtree)->ksize)->
              seqtree);
      pcVar9 = (code *)((long)pcVar9 + 1);
    } while ((code *)pcVar28 != pcVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0x14);
  pcStack_898 = (code *)0x11a7cb;
  fdb_commit((fdb_file_handle *)pfStack_888,'\0');
  pfVar17 = (fdb_kvs_handle *)&pfStack_878;
  pcStack_898 = (code *)0x11a7e4;
  fVar2 = fdb_open((fdb_file_handle **)pfVar17,"./mvcc_test1",&fStack_690);
  pcVar24 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_898 = (code *)0x11a7fd;
    pfVar17 = pfStack_878;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_878,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a990;
    pcStack_898 = (code *)0x11a80f;
    fdb_close((fdb_file_handle *)pfStack_878);
    pcVar25 = auStack_870 + 0x30;
    unaff_R12.seqtree = (btree *)(auStack_870 + 0x40);
    pcVar28 = (char *)(ulong)(uint)((int)pcVar28 << 3);
    pcVar24 = (char *)0x0;
    unaff_R13.seqtree = (btree *)(auStack_870 + 0x20);
    do {
      pcVar9 = (code *)(auStack_870 + (long)pcVar24);
      pcStack_898 = (code *)0x11a836;
      pfVar17 = (fdb_kvs_handle *)pcVar9;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar9,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a97c;
      pfVar17 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar9)->kvs_config;
      pcStack_898 = (code *)0x11a849;
      fVar2 = fdb_get_kvs_info(pfVar17,(fdb_kvs_info *)unaff_R13.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a977;
      if ((hbtrie *)auStack_870._40_8_ != (hbtrie *)0x0) {
        pcStack_898 = (code *)0x11a8af;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_870._48_8_ != (btree *)0x0) {
        pcStack_898 = (code *)0x11a8b9;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_870._64_8_ != (filemgr *)0x0) {
        pcStack_898 = (code *)0x11a8c3;
        rollback_to_zero_after_compact_test();
      }
      pfVar17 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar9)->kvs_config;
      pcStack_898 = (code *)0x11a879;
      fVar2 = fdb_get(pfVar17,(fdb_doc *)aaStack_730[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a986;
      pfVar17 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar9)->kvs_config;
      pcStack_898 = (code *)0x11a892;
      fVar2 = fdb_set(pfVar17,(fdb_doc *)aaStack_730[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a981;
      pcVar24 = pcVar24 + 8;
    } while (pcVar28 != pcVar24);
    pcStack_898 = (code *)0x11a8d4;
    pfVar17 = pfStack_888;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_888,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_898 = (code *)0x11a8e6;
      fdb_close((fdb_file_handle *)pfStack_888);
      lVar12 = 0;
      do {
        pcStack_898 = (code *)0x11a8f5;
        fdb_doc_free((fdb_doc *)aaStack_730[lVar12].seqtree);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x14);
      pcStack_898 = (code *)0x11a903;
      fdb_shutdown();
      pcVar28 = "single kv mode:";
      if ((char)iStack_87c != '\0') {
        pcVar28 = "multiple kv mode:";
      }
      pcStack_898 = (code *)0x11a933;
      sprintf(acStack_780,"rollback to zero after compact test %s",pcVar28);
      pcVar28 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      pcStack_898 = (code *)0x11a960;
      fprintf(_stderr,pcVar28,acStack_780);
      return;
    }
  }
  else {
LAB_0011a98b:
    pcStack_898 = (code *)0x11a990;
    rollback_to_zero_after_compact_test();
LAB_0011a990:
    pcStack_898 = (code *)0x11a995;
    rollback_to_zero_after_compact_test();
  }
  pcStack_898 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s = (char *)((ulong)pfVar17 & 0xffffffff);
  pcStack_16a0 = (code *)0x11a9b9;
  pfStack_8c0 = (fdb_kvs_handle *)pcVar9;
  aStack_8b8 = unaff_R12;
  aStack_8b0 = unaff_R13;
  pcStack_8a8 = pcVar24;
  pcStack_8a0 = pcVar25;
  pcStack_898 = (code *)pcVar28;
  gettimeofday(&tStack_1650,(__timezone_ptr_t)0x0);
  pcStack_16a0 = (code *)0x11a9be;
  memleak_start();
  pcStack_16a0 = (code *)0x11a9ca;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_16a0 = (code *)0x11a9da;
  fdb_get_default_config();
  config = &fStack_1640;
  pcStack_16a0 = (code *)0x11a9e7;
  fdb_get_default_kvs_config();
  fStack_1320.buffercache_size = 0;
  fStack_1320.wal_threshold = 0x100;
  fStack_1320.flags = 1;
  fStack_1320.compaction_threshold = '\0';
  uStack_1664 = SUB84(pfVar17,0);
  fStack_1320.multi_kv_instances = SUB81(__s,0);
  doc_00 = (fdb_doc *)(auStack_1688 + 0x18);
  pcStack_16a0 = (code *)0x11aa21;
  fdb_open((fdb_file_handle **)doc_00,"./mvcc_test8",&fStack_1320);
  ptr_handle = (fdb_doc *)auStack_1688;
  pcStack_16a0 = (code *)0x11aa34;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1688._24_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_16a0 = (code *)0x11aa4a;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1688._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar12 = 0;
    uVar21 = 0;
    do {
      pcStack_16a0 = (code *)0x11aa74;
      sprintf(acStack_1528,"key%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11aa8d;
      sprintf(acStack_1428,"meta%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11aaa3;
      sprintf((char *)afStack_1628,"body%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11aab6;
      sVar5 = strlen(acStack_1528);
      pcStack_16a0 = (code *)0x11aac9;
      sVar6 = strlen(acStack_1428);
      pcStack_16a0 = (code *)0x11aad6;
      sVar7 = strlen((char *)afStack_1628);
      pcStack_16a0 = (code *)0x11aaf8;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1228 + lVar12),acStack_1528,sVar5,acStack_1428,
                     sVar6,afStack_1628,sVar7);
      pcStack_16a0 = (code *)0x11ab0a;
      fdb_set((fdb_kvs_handle *)auStack_1688._0_8_,(&pfStack_1228)[uVar21]);
      uVar21 = uVar21 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar21 != 300);
    pcStack_16a0 = (code *)0x11ab2a;
    fdb_commit((fdb_file_handle *)auStack_1688._24_8_,'\0');
    lVar12 = 0;
    uVar21 = 0;
    do {
      ppfStack_1658 = (fdb_doc **)((long)&pfStack_1228 + lVar12);
      pcStack_16a0 = (code *)0x11ab4c;
      fdb_doc_free((&pfStack_1228)[uVar21]);
      pcStack_16a0 = (code *)0x11ab68;
      sprintf(acStack_1528,"key%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11ab84;
      sprintf(acStack_1428,"META%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11ab9d;
      sprintf((char *)afStack_1628,"BODY%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11aba5;
      sVar5 = strlen(acStack_1528);
      pcStack_16a0 = (code *)0x11abb0;
      sVar6 = strlen(acStack_1428);
      pcStack_16a0 = (code *)0x11abbb;
      sVar7 = strlen((char *)afStack_1628);
      pcStack_16a0 = (code *)0x11abdd;
      fdb_doc_create(ppfStack_1658,acStack_1528,sVar5,acStack_1428,sVar6,afStack_1628,sVar7);
      pcStack_16a0 = (code *)0x11abef;
      fdb_set((fdb_kvs_handle *)auStack_1688._0_8_,(&pfStack_1228)[uVar21]);
      uVar21 = uVar21 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar21 != 0x96);
    pcStack_16a0 = (code *)0x11ac0f;
    fdb_commit((fdb_file_handle *)auStack_1688._24_8_,'\0');
    uVar21 = 0x96;
    doc_00 = afStack_d78;
    do {
      pcStack_16a0 = (code *)0x11ac25;
      fdb_doc_free((fdb_doc *)doc_00->keylen);
      pcStack_16a0 = (code *)0x11ac41;
      sprintf(acStack_1528,"key%d",uVar21 & 0xffffffff);
      __s = acStack_1428;
      pcStack_16a0 = (code *)0x11ac5d;
      sprintf(__s,"Meta%d",uVar21 & 0xffffffff);
      ptr_handle = afStack_1628;
      pcStack_16a0 = (code *)0x11ac76;
      sprintf((char *)ptr_handle,"Body%d",uVar21 & 0xffffffff);
      pcStack_16a0 = (code *)0x11ac7e;
      unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1528);
      pcStack_16a0 = (code *)0x11ac89;
      unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s);
      pcStack_16a0 = (code *)0x11ac94;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_16a0 = (code *)0x11acb4;
      fdb_doc_create((fdb_doc **)doc_00,acStack_1528,(size_t)unaff_R12,__s,(size_t)unaff_R13,
                     ptr_handle,sVar5);
      pcStack_16a0 = (code *)0x11acc1;
      fdb_set((fdb_kvs_handle *)auStack_1688._0_8_,(fdb_doc *)doc_00->keylen);
      uVar21 = uVar21 + 1;
      doc_00 = (fdb_doc *)&doc_00->metalen;
    } while (uVar21 != 300);
    pcStack_16a0 = (code *)0x11ace1;
    fdb_commit((fdb_file_handle *)auStack_1688._24_8_,'\0');
    pcStack_16a0 = (code *)0x11acf0;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1688,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae48;
    pcStack_16a0 = (code *)0x11ad21;
    fdb_doc_create((fdb_doc **)(auStack_1688 + 0x10),(void *)psStack_1220[4],*psStack_1220,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_16a0 = (code *)0x11ad35;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1688._0_8_,&pfStack_1660,0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae4d;
    pcStack_16a0 = (code *)0x11ad4c;
    fVar2 = fdb_get(pfStack_1660,(fdb_doc *)auStack_1688._16_8_);
    pfVar29 = (fdb_doc *)auStack_1688._16_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae52;
    ptr_handle = *(fdb_doc **)(auStack_1688._16_8_ + 0x40);
    config = (fdb_kvs_config *)psStack_1220[8];
    pcStack_16a0 = (code *)0x11ad78;
    iVar3 = bcmp(ptr_handle,config,*(size_t *)(auStack_1688._16_8_ + 0x10));
    if (iVar3 == 0) {
      if (*(uint64_t *)((long)pfVar29 + 0x28) != 0x12e) {
        pcStack_16a0 = (code *)0x11ad94;
        rollback_to_wal_test();
      }
      pcStack_16a0 = (code *)0x11ad9e;
      fdb_doc_free((fdb_doc *)auStack_1688._16_8_);
      pcStack_16a0 = (code *)0x11ada8;
      fdb_kvs_close(pfStack_1660);
      pcStack_16a0 = (code *)0x11adb2;
      fdb_close((fdb_file_handle *)auStack_1688._24_8_);
      lVar12 = 0;
      do {
        pcStack_16a0 = (code *)0x11adc1;
        fdb_doc_free((&pfStack_1228)[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 300);
      pcStack_16a0 = (code *)0x11add2;
      fdb_shutdown();
      pcStack_16a0 = (code *)0x11add7;
      memleak_end();
      pcVar28 = "single kv mode:";
      if ((char)uStack_1664 != '\0') {
        pcVar28 = "multiple kv mode:";
      }
      pcStack_16a0 = (code *)0x11ae04;
      sprintf((char *)afStack_1628,"rollback to wal test %s",pcVar28);
      pcVar28 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      pcStack_16a0 = (code *)0x11ae31;
      fprintf(_stderr,pcVar28,afStack_1628);
      return;
    }
  }
  else {
    pcStack_16a0 = (code *)0x11ae48;
    rollback_to_wal_test();
LAB_0011ae48:
    pcStack_16a0 = (code *)0x11ae4d;
    rollback_to_wal_test();
LAB_0011ae4d:
    pcStack_16a0 = (code *)0x11ae52;
    rollback_to_wal_test();
LAB_0011ae52:
    pfVar29 = doc_00;
    pcStack_16a0 = (code *)0x11ae57;
    rollback_to_wal_test();
  }
  pcStack_16a0 = rollback_all_test;
  pfVar19 = config;
  rollback_to_wal_test();
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae87;
  pfStack_16c8 = ptr_handle;
  aStack_16c0 = unaff_R12;
  aStack_16b8 = unaff_R13;
  pfStack_16b0 = config;
  pfStack_16a8 = pfVar29;
  pcStack_16a0 = (code *)__s;
  gettimeofday(&tStack_1b70,(__timezone_ptr_t)0x0);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae8c;
  memleak_start();
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aea8;
  fdb_get_default_config();
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aeb2;
  fdb_get_default_kvs_config();
  fStack_17c0.buffercache_size._0_1_ = '\0';
  fStack_17c0.buffercache_size._1_1_ = '\0';
  fStack_17c0.buffercache_size._2_1_ = '\0';
  fStack_17c0.buffercache_size._3_1_ = '\0';
  fStack_17c0.buffercache_size._4_1_ = '\0';
  fStack_17c0.buffercache_size._5_1_ = '\0';
  fStack_17c0.buffercache_size._6_1_ = '\0';
  fStack_17c0.buffercache_size._7_1_ = '\0';
  fStack_17c0.wal_threshold._0_1_ = '\0';
  fStack_17c0.wal_threshold._1_1_ = '\x04';
  fStack_17c0.wal_threshold._2_1_ = '\0';
  fStack_17c0.wal_threshold._3_1_ = '\0';
  fStack_17c0.wal_threshold._4_1_ = '\0';
  fStack_17c0.wal_threshold._5_1_ = '\0';
  fStack_17c0.wal_threshold._6_1_ = '\0';
  fStack_17c0.wal_threshold._7_1_ = '\0';
  fStack_17c0.flags = 1;
  fStack_17c0.compaction_threshold = 0;
  fStack_17c0.block_reusing_threshold = 0;
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aee8;
  fStack_17c0.multi_kv_instances = (bool)(char)pfVar19;
  fdb_open(&pfStack_1c18,"./mvcc_test6",(fdb_config *)(acStack_18c0 + 0x100));
  uStack_1c0c = (uint)pfVar19;
  if (uStack_1c0c == 0) {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af54;
    fdb_kvs_open_default
              (pfStack_1c18,(fdb_kvs_handle **)&aaStack_1bf0[0].seqtree,
               (fdb_kvs_config *)(acStack_1bc0 + 8));
    aVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    ptr_handle_00 = aaStack_1bf0;
    unaff_R12.seqtree = (btree *)(acStack_1bc0 + 8);
    uVar21 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af19;
      sprintf(acStack_1bc0,"kv%d",uVar21 & 0xffffffff);
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af2c;
      fdb_kvs_open(pfStack_1c18,(fdb_kvs_handle **)&ptr_handle_00->seqtree,acStack_1bc0,
                   (fdb_kvs_config *)unaff_R12.seqtree);
      uVar21 = uVar21 + 1;
      ptr_handle_00 = ptr_handle_00 + 1;
    } while (uVar21 != 4);
    aVar13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar25 = (char *)0x0;
  pcVar9 = logCallbackFunc;
  pcVar28 = "rollback_all_test";
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11af7a;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_1bf0[(long)pcVar25].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar25 = (char *)((hbtrie_func_readkey *)pcVar25 + 1);
  } while (aVar13.seqtree != (btree *)pcVar25);
  uVar21 = 0;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afa9;
    sprintf(acStack_19c0,"key%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afc5;
    sprintf(acStack_1ac0,"meta%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe1;
    sprintf(acStack_18c0,"body%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff4;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afff;
    sVar6 = strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00a;
    sVar7 = strlen(acStack_18c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b02f;
    fdb_doc_create((fdb_doc **)&aaStack_1b60[uVar21].seqtree,acStack_19c0,sVar5,acStack_1ac0,sVar6,
                   acStack_18c0,sVar7);
    lVar12 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b03f;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[lVar12].seqtree,(fdb_doc *)aaStack_1b60[uVar21].seqtree
             );
      lVar12 = lVar12 + 1;
    } while (aVar13.seqtree != (btree *)lVar12);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 5);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b063;
  fdb_commit(pfStack_1c18,'\x01');
  uVar21 = 5;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b085;
    sprintf(acStack_19c0,"key%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0a1;
    sprintf(acStack_1ac0,"meta%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0bd;
    sprintf(acStack_18c0,"body%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d0;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0db;
    sVar6 = strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0e6;
    sVar7 = strlen(acStack_18c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b10b;
    fdb_doc_create((fdb_doc **)&aaStack_1b60[uVar21].seqtree,acStack_19c0,sVar5,acStack_1ac0,sVar6,
                   acStack_18c0,sVar7);
    lVar12 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b11c;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[lVar12].seqtree,(fdb_doc *)aaStack_1b60[uVar21].seqtree
             );
      lVar12 = lVar12 + 1;
    } while (aVar13.seqtree != (btree *)lVar12);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13d;
  fdb_commit(pfStack_1c18,'\0');
  uVar21 = 10;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15f;
    sprintf(acStack_19c0,"key%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b17b;
    sprintf(acStack_1ac0,"meta%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b197;
    sprintf(acStack_18c0,"body%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1aa;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1b5;
    sVar6 = strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
    sVar7 = strlen(acStack_18c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e5;
    fdb_doc_create((fdb_doc **)&aaStack_1b60[uVar21].seqtree,acStack_19c0,sVar5,acStack_1ac0,sVar6,
                   acStack_18c0,sVar7);
    lVar12 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1f6;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[lVar12].seqtree,(fdb_doc *)aaStack_1b60[uVar21].seqtree
             );
      lVar12 = lVar12 + 1;
    } while (aVar13.seqtree != (btree *)lVar12);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0xf);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
  fdb_commit(pfStack_1c18,'\x01');
  uVar21 = 0xf;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b23c;
    sprintf(acStack_19c0,"key%d",uVar21 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b258;
    sprintf(acStack_1ac0,"meta%d",uVar21 & 0xffffffff);
    aVar16.seqtree = (btree *)acStack_18c0;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b274;
    sprintf((char *)aVar16.seqtree,"body%d",uVar21 & 0xffffffff);
    unaff_R12.seqtree = (btree *)(aaStack_1b60 + uVar21);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b287;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b292;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29d;
    sVar6 = strlen((char *)aVar16.seqtree);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2c2;
    fdb_doc_create((fdb_doc **)unaff_R12.seqtree,acStack_19c0,sVar5,acStack_1ac0,(size_t)unaff_R13,
                   aVar16.seqtree,sVar6);
    pcVar25 = (char *)0x0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d3;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[(long)pcVar25].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R12.seqtree)->ksize)->
              seqtree);
      pcVar25 = (char *)((long)pcVar25 + 1);
    } while (aVar13.seqtree != (btree *)pcVar25);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0x14);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
  fdb_commit(pfStack_1c18,'\0');
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_1c18,(fdb_snapshot_info_t **)&pfStack_1c00,(uint64_t *)&pfStack_1c08);
  pcVar28 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar25 = (char *)(ulong)uStack_1c0c;
    cVar22 = (char)uStack_1c0c;
    if (cVar22 == '\0') {
      if (pfStack_1c08 != (fdb_kvs_handle *)0x4) {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b341;
        rollback_all_test();
      }
    }
    else if (pfStack_1c08 != (fdb_kvs_handle *)0x8) {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b32f;
      rollback_all_test();
    }
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b354;
    fVar2 = fdb_rollback_all(pfStack_1c18,(fdb_snapshot_marker_t)pfStack_1c00->kvs);
    if (cVar22 == '\0') {
LAB_0011b41a:
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
      unaff_R13.seqtree = (btree *)&aStack_1bf8;
      if (cVar22 != '\0') {
        pcVar28 = acStack_1bc0;
        pcVar25 = "rollback_all_test";
        aVar16.seqtree = (btree *)0x0;
        unaff_R12 = aVar13;
        do {
          unaff_R13.seqtree = unaff_R13.seqtree + 8;
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b450;
          sprintf(pcVar28,"kv%d",aVar16.seqtree);
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
          fVar2 = fdb_kvs_open(pfStack_1c18,(fdb_kvs_handle **)unaff_R13.seqtree,pcVar28,
                               (fdb_kvs_config *)(acStack_1bc0 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b480;
          fVar2 = fdb_set_log_callback
                            (*(fdb_kvs_handle **)unaff_R13.seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
          aVar16._0_4_ = aVar16._0_4_ + 1;
          aVar16._4_4_ = 0;
          unaff_R12.seqtree = (btree *)((long)(unaff_R12.seqtree + -1) + 0x37);
        } while (unaff_R12.seqtree != (btree *)0x0);
      }
      unaff_R12.seqtree = (btree *)0x0;
      unaff_R13.seqtree = (btree *)&aStack_1bf8;
      pcVar28 = (char *)&aStack_1bc8;
      do {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4b2;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_1bf0[(long)unaff_R12].seqtree,
                                 &fStack_1ba0);
        pcVar9 = (code *)aVar16;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
        if (fStack_1ba0.last_seqnum != 0xf) {
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b566;
          rollback_all_test();
        }
        if (fStack_1ba0.doc_count != 0xf) {
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b578;
          rollback_all_test();
        }
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ea;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_1bf0[(long)unaff_R12].seqtree,pfStack_1ac8);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b512;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_1bf0[(long)unaff_R12].seqtree,
                           (aaStack_1b60[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_1b60[0].seqtree)->ksize,(void **)unaff_R13.seqtree,
                           (size_t *)pcVar28);
        pcVar9 = (code *)aStack_1bf8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
        pcVar25 = (char *)(aaStack_1b60[0].seqtrie)->readkey;
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b53b;
        iVar3 = bcmp(pcVar25,aStack_1bf8.seqtree,(size_t)aStack_1bc8);
        if (iVar3 != 0) goto LAB_0011b67c;
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b54b;
        free(pcVar9);
        uVar8 = uStack_1c0c;
        unaff_R12.seqtree = (btree *)&(unaff_R12.seqtree)->vsize;
        aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar13.seqtree != unaff_R12.seqtree);
      aVar16.seqtree = (btree *)0x0;
      pcVar25 = (char *)(ulong)uStack_1c0c;
      do {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b596;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_1bf0[(long)aVar16].seqtree,
                        (fdb_doc *)aaStack_1b60[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
        aVar16.seqtree = (btree *)&(aVar16.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar13.seqtree != aVar16.seqtree);
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5b5;
      fVar2 = fdb_commit(pfStack_1c18,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5c7;
      fdb_close(pfStack_1c18);
      lVar12 = 0;
      do {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d6;
        fdb_doc_free((fdb_doc *)aaStack_1b60[lVar12].seqtree);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x14);
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5ee;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1c00,(uint64_t)pfStack_1c08);
      aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5fb;
        fdb_shutdown();
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b600;
        memleak_end();
        pcVar28 = "single kv mode:";
        if ((char)uVar8 != '\0') {
          pcVar28 = "multiple kv mode:";
        }
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b62e;
        sprintf(acStack_18c0,"rollback all test %s",pcVar28);
        pcVar28 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar28 = "%s FAILED\n";
        }
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b65b;
        fprintf(_stderr,pcVar28,acStack_18c0);
        return;
      }
      goto LAB_0011b6a7;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b372;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_1bf0[(long)aVar16].seqtree);
      aVar16.seqtree = aVar16.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar13.seqtree != aVar16.seqtree);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b396;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_1ba0,"./mvcc_test6",
                     (fdb_config *)(acStack_18c0 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3bc;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1ba0.name,(fdb_kvs_handle **)&aStack_1bf8.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_1bc0 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d7;
    fVar2 = fdb_rollback_all(pfStack_1c18,(fdb_snapshot_marker_t)pfStack_1c00->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ea;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1bf8.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ff;
    fVar2 = fdb_close((fdb_file_handle *)fStack_1ba0.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41a;
      fVar2 = fdb_rollback_all(pfStack_1c18,(fdb_snapshot_marker_t)pfStack_1c00->kvs);
      goto LAB_0011b41a;
    }
  }
  else {
LAB_0011b698:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69d;
    rollback_all_test();
LAB_0011b69d:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a2;
    rollback_all_test();
LAB_0011b6a2:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6a7;
    rollback_all_test();
LAB_0011b6a7:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
    rollback_all_test();
LAB_0011b6ac:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b1;
    rollback_all_test();
LAB_0011b6b1:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6b6;
    rollback_all_test();
LAB_0011b6b6:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6bb;
    rollback_all_test();
LAB_0011b6bb:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c0;
    rollback_all_test();
LAB_0011b6c0:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c5;
    rollback_all_test();
  }
  aStack_1c28.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6e7;
  aStack_1c50 = aVar16;
  aStack_1c48 = unaff_R12;
  aStack_1c40 = unaff_R13;
  phStack_1c38 = (hbtrie_func_readkey *)pcVar25;
  aStack_1c30 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
  aStack_1c28 = aVar13;
  gettimeofday(&tStack_1da8,(__timezone_ptr_t)0x0);
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ec;
  memleak_start();
  puVar26 = &uStack_1dec;
  uStack_1dec = 0;
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00.seqtree = (btree *)auStack_1d48;
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b714;
  fdb_get_default_config();
  uStack_1d1a = 1;
  uStack_1d28 = 1;
  pcStack_1cf0 = compaction_cb_count;
  uStack_1ce8 = 0x20;
  uStack_1d10 = 1;
  aVar16.seqtree = (btree *)0x156054;
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74e;
  puStack_1ce0 = puVar26;
  fVar2 = fdb_open(&pfStack_1df8,"mvcc_test1",(fdb_config *)fconfig_00.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00.seqtree = (btree *)afStack_1de8;
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b763;
    fdb_get_default_kvs_config();
    fStack_1d98.custom_cmp_param = afStack_1de8[0].custom_cmp_param;
    fStack_1d98.create_if_missing = afStack_1de8[0].create_if_missing;
    fStack_1d98._1_7_ = afStack_1de8[0]._1_7_;
    fStack_1d98.custom_cmp = afStack_1de8[0].custom_cmp;
    aVar16.seqtree = (btree *)&aStack_1e00;
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b788;
    fVar2 = fdb_kvs_open_default(pfStack_1df8,(fdb_kvs_handle **)aVar16.seqtree,&fStack_1d98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    unaff_R13.seqtree = (btree *)0x156958;
    unaff_R12.seqtree = (btree *)0x0;
    do {
      pcVar28 = (char *)0xcccccccd;
      aVar14.seqtree = (btree *)0x1565bd;
      aVar16.seqtree = (btree *)afStack_1de8;
      iVar3 = unaff_R12._0_4_;
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7bc;
      sprintf((char *)aVar16.seqtree,"%d",unaff_R12.seqtree);
      aVar13 = aStack_1e00;
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7c9;
      sVar5 = strlen((char *)aVar16.seqtree);
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar13.seqtree,aVar16.seqtree,sVar5,"value",5);
      aVar15.seqtree = unaff_R13.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        fconfig_00 = aVar13;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3c;
        auto_compaction_snapshots_test();
        unaff_R13 = aVar15;
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
LAB_0011ba3c:
        aVar15 = unaff_R13;
        unaff_R13 = aVar14;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5b;
        aVar16 = fconfig_00;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba60;
        auto_compaction_snapshots_test();
        aVar13 = unaff_R13;
        pcVar28 = (char *)doc_01;
LAB_0011ba60:
        unaff_R13 = aVar15;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        puVar26 = (uint *)afStack_1de8;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      aVar13 = unaff_R12;
      if ((int)((ulong)unaff_R12.seqtree / 10) * 10 == iVar3) {
        aVar16.seqtree = (btree *)0x0;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80c;
        fVar2 = fdb_commit(pfStack_1df8,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      fconfig_00 = unaff_R12;
      if ((int)((ulong)unaff_R12.seqtree / 100) * 100 == iVar3) {
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b83d;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_1e00.seqtree,&fStack_1d78);
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_1d78.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b85f;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1e00.seqtree,&pfStack_1e08,
                                  fStack_1d78.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b885;
        fdb_doc_create((fdb_doc **)&aStack_1e10.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_1e10.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_1e08,(fdb_doc *)aStack_1e10.seqtree);
        aVar15 = aStack_1e10;
        doc_01.seqtree = (btree *)pcVar28;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar28 = (char *)(aStack_1e10.seqtrie)->aux;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8b9;
        sVar5 = strlen(&afStack_1de8[0].create_if_missing);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c7;
        iVar4 = bcmp(pcVar28,afStack_1de8,sVar5);
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
        if (iVar4 != 0) goto LAB_0011ba41;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8d7;
        fdb_doc_free((fdb_doc *)aVar15.seqtree);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_1e08);
        aVar14.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        aVar16.seqtree = (btree *)&pfStack_1e08;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ff;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1e00.seqtree,
                                  (fdb_kvs_handle **)aVar16.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b925;
        fdb_doc_create((fdb_doc **)&aStack_1e10.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_1e10.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b938;
        aVar16 = aStack_1e10;
        fVar2 = fdb_get_byseq(pfStack_1e08,(fdb_doc *)aStack_1e10.seqtree);
        doc_01 = aStack_1e10;
        aVar13.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_1e10.seqtrie)->aux;
        aVar16.seqtree = (btree *)afStack_1de8;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b956;
        sVar5 = strlen((char *)aVar16.seqtree);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b964;
        iVar4 = bcmp(fconfig_00.seqtree,aVar16.seqtree,sVar5);
        if (iVar4 != 0) goto LAB_0011ba4e;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b974;
        fdb_doc_free((fdb_doc *)doc_01.seqtree);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_1e08);
        pcVar28 = (char *)0xcccccccd;
        aVar13.seqtree = (btree *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      puVar26 = (uint *)afStack_1de8;
      pcVar28 = (char *)0xcccccccd;
      aVar13.seqtree = (btree *)0x1565bd;
      unaff_R12._0_4_ = iVar3 + 1;
      unaff_R12._4_4_ = 0;
    } while (unaff_R12._0_4_ != 100000);
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9b0;
    fVar2 = fdb_close(pfStack_1df8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9ca;
      memleak_end();
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e4;
      sprintf(&afStack_1de8[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_1dec);
      pcVar28 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba11;
      fprintf(_stderr,pcVar28,afStack_1de8);
      return;
    }
  }
  else {
LAB_0011ba6a:
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba79;
    auto_compaction_snapshots_test();
  }
  aStack_1e20.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar15.seqtree = aVar16.seqtree & 0xffffffff;
  __tv = &tStack_1e38;
  aStack_1e48 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba95;
  aStack_1e28 = fconfig_00;
  aStack_1e20 = aVar13;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar16._0_4_ == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&(aStack_1e10.seqtree)->ksize = *(int *)&(aStack_1e10.seqtree)->ksize + 1;
      return;
    }
  }
  else {
    aStack_1e48 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
    compaction_cb_count();
  }
  aStack_1e48.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad9;
  aStack_1e68 = unaff_R12;
  aStack_1e60 = unaff_R13;
  puStack_1e58 = puVar26;
  aStack_1e50 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
  aStack_1e48.seqtree = aVar15.seqtree;
  gettimeofday((timeval *)(acStack_209f + 0x2f),(__timezone_ptr_t)0x0);
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bade;
  memleak_start();
  iStack_20bc = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb08;
    fdb_get_default_config();
    fconfig_02 = &fStack_1f68;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb20;
    memcpy(fconfig_02,auStack_2060,0xf8);
    fStack_1f68.block_reusing_threshold = 0;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb3f;
    fVar2 = fdb_open(&pfStack_20b0,"mvcc_test1",fconfig_02);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb54;
      fdb_get_default_kvs_config();
      uStack_2078 = uStack_2050;
      pcStack_2088 = (char *)auStack_2060._0_8_;
      pfStack_2080 = (fdb_config *)auStack_2060._8_8_;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb76;
      fVar2 = fdb_kvs_open_default
                        (pfStack_20b0,(fdb_kvs_handle **)&aStack_20b8.seqtree,
                         (fdb_kvs_config *)(acStack_209f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_20bc) {
        unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_2060 >> 8),1);
        uVar8 = 0;
        do {
          aVar15._0_4_ = uVar8 + 1;
          aVar15._4_4_ = 0;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb0;
          sprintf(acStack_209f,"%d",aVar15.seqtree);
          unaff_R12 = aStack_20b8;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbd;
          sVar5 = strlen(acStack_209f);
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd8;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R12.seqtree,acStack_209f,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar10 = __tv;
          if ((int)((ulong)unaff_R13.seqtree / 10) * 10 - 1U == uVar8) {
            ptVar10 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc18;
            fdb_commit(pfStack_20b0,~(byte)__tv & 1);
          }
          unaff_R13._0_4_ = unaff_R13._0_4_ + 1;
          unaff_R13._4_4_ = 0;
          __tv = ptVar10;
          uVar8 = aVar15._0_4_;
        } while ((int)aVar15._0_4_ < iStack_20bc);
      }
      aVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3f;
      fdb_commit(pfStack_20b0,'\x01');
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc4e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_20b8.seqtree,(fdb_kvs_info *)auStack_2060);
      __tv = (timeval *)(auStack_2060 + 8);
      if ((fdb_config *)auStack_2060._8_8_ != (fdb_config *)(long)iStack_20bc) {
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc6a;
        rollback_during_ops_test();
      }
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc82;
      pthread_create(&pStack_20a8,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_20bc);
      fconfig_02 = (fdb_config *)0x156958;
      pcVar28 = acStack_209f;
      unaff_R12.seqtree = (btree *)0x1565bd;
      do {
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bca4;
        sprintf(pcVar28,"%d",aVar15.seqtree);
        unaff_R13 = aStack_20b8;
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb1;
        sVar5 = strlen(pcVar28);
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcc8;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar28,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bce4;
          fVar2 = fdb_commit(pfStack_20b0,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        aVar15._0_4_ = aVar15._0_4_ + 1;
        aVar15._4_4_ = 0;
      } while (aVar15._0_4_ != 0x2711);
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd0a;
      pthread_join(pStack_20a8,(void **)(acStack_209f + 0xf));
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2d;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_20b8.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd44;
      fVar2 = fdb_commit(pfStack_20b0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd5e;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_20b8.seqtree,(fdb_kvs_info *)auStack_2060);
      fconfig_02 = (fdb_config *)auStack_2060._8_8_;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd85;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_20b8.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_20b8.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc7;
      fVar2 = fdb_commit(pfStack_20b0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bddc;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_20b8.seqtree,(fdb_seqnum_t)fconfig_02);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf6;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_20b8.seqtree,(fdb_kvs_info *)auStack_2060);
        if ((fdb_config *)auStack_2060._8_8_ != fconfig_02) {
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be07;
          rollback_during_ops_test();
        }
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be11;
        fdb_close(pfStack_20b0);
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be16;
        fdb_shutdown();
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be1b;
        memleak_end();
        pcVar28 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar28 = "%s FAILED\n";
        }
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be4c;
        fprintf(_stderr,pcVar28,"rollback during ops test");
        return;
      }
    }
    else {
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_2060;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfbb;
      rollback_during_ops_test();
    }
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_02 = (fdb_config *)auStack_2060;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be7c;
    fdb_get_default_config();
    pcVar28 = (char *)&fStack_1f68;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be94;
    memcpy(pcVar28,fconfig_02,0xf8);
    fStack_1f68.block_reusing_threshold = 0;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beb3;
    fVar2 = fdb_open(&pfStack_20b0,"mvcc_test1",(fdb_config *)pcVar28);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_02 = (fdb_config *)auStack_2060;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bec8;
    fdb_get_default_kvs_config();
    uStack_2078 = uStack_2050;
    pcStack_2088 = (char *)auStack_2060._0_8_;
    pfStack_2080 = (fdb_config *)auStack_2060._8_8_;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11beeb;
    fVar2 = fdb_kvs_open_default
                      (pfStack_20b0,(fdb_kvs_handle **)&aStack_20b8.seqtree,
                       (fdb_kvs_config *)(acStack_209f + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_20bc = (int)__tv->tv_sec;
      if (1 < (long)iStack_20bc) {
        unaff_R13.seqtree = (btree *)0xcccccccd;
        fconfig_02 = (fdb_config *)0x156958;
        pcVar28 = acStack_209f;
        unaff_R12.seqtree = (btree *)0x1565bd;
        __tv = (timeval *)(long)iStack_20bc;
        do {
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf2c;
          sprintf(pcVar28,"%d",(ulong)__tv & 0xffffffff);
          aVar15 = aStack_20b8;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf39;
          sVar5 = strlen(pcVar28);
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf50;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar15.seqtree,pcVar28,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf76;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_20b8.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf91;
      fdb_close(pfStack_20b0);
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  aStack_20d0.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff0;
  ptStack_20f0 = __tv;
  aStack_20e8 = unaff_R12;
  aStack_20e0 = unaff_R13;
  pfStack_20d8 = fconfig_02;
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
  gettimeofday((timeval *)(auStack_224f + 0xf),(__timezone_ptr_t)0x0);
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff5;
  memleak_start();
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_21e8;
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c011;
  fdb_get_default_config();
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c025;
  fVar2 = fdb_open(&pfStack_2270,"mvcc_test1",fconfig_01);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)(auStack_2230 + 0x30);
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c03d;
    fdb_get_default_kvs_config();
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c04f;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2270,(fdb_kvs_handle **)&aStack_2278.seqtree,
                       (fdb_kvs_config *)fconfig_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_01 = (fdb_config *)0x1;
    fconfig_02 = (fdb_config *)0x156958;
    pcVar28 = auStack_224f;
    unaff_R12.seqtree = (btree *)0x1565bd;
    do {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07e;
      sprintf(pcVar28,"%d",fconfig_01);
      unaff_R13 = aStack_2278;
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c08b;
      sVar5 = strlen(pcVar28);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0a2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar28,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar8 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar8;
    } while (uVar8 != 4);
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0bd;
    fdb_commit(pfStack_2270,'\0');
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e0;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2278.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10b;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2278.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c122;
    fVar2 = fdb_commit(pfStack_2270,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c139;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2278.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_01 = (fdb_config *)auStack_2230;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_2278.seqtree,(fdb_kvs_info *)fconfig_01);
    if (auStack_2230._8_8_ != 3) {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17a;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2278.seqtree,&pfStack_2258,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1a2;
    fdb_iterator_init(pfStack_2258,&pfStack_2268,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_01 = (fdb_config *)&pfStack_2260;
    pfStack_2260 = (fdb_doc *)0x0;
    fconfig_02 = (fdb_config *)0x3;
    do {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_2268,(fdb_doc **)fconfig_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1d3;
      fdb_doc_free(pfStack_2260);
      pfStack_2260 = (fdb_doc *)0x0;
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_2268);
      fconfig_02 = (fdb_config *)&fconfig_02[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_02 == (fdb_config *)0x0) {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c201;
      fdb_iterator_close(pfStack_2268);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c20b;
      fdb_kvs_close(pfStack_2258);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c215;
      fdb_close(pfStack_2270);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21a;
      fdb_shutdown();
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c21f;
      memleak_end();
      pcVar28 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c250;
      fprintf(_stderr,pcVar28,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  aStack_2288.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_4740 = (code *)0x11c2b0;
  pfStack_22b0 = fconfig_01;
  aStack_22a8 = unaff_R12;
  aStack_22a0 = unaff_R13;
  pfStack_2298 = fconfig_02;
  aStack_2290 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar28;
  aStack_2288 = aVar15;
  gettimeofday(&tStack_46c8,(__timezone_ptr_t)0x0);
  pcStack_4740 = (code *)0x11c2b5;
  memleak_start();
  pcStack_4740 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4740 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_4740 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_45b0.wal_threshold = 0x400;
  fStack_45b0.compaction_mode = 0;
  fStack_45b0.durability_opt = 2;
  pfVar17 = (fdb_kvs_handle *)(apfStack_43b8 + 0x20);
  ppfVar11 = apfStack_46b8;
  pcVar28 = "kvs%d";
  uVar21 = 0;
  ppfVar27 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_4740 = (code *)0x11c31b;
    sprintf((char *)ppfVar11,"mvcc_test%d",(ulong)ppfVar27 & 0xffffffff);
    pcVar25 = (char *)(apfStack_4728 + (long)ppfVar27);
    pcStack_4740 = (code *)0x11c336;
    ppfVar20 = (fdb_kvs_handle **)pcVar25;
    fVar2 = fdb_open((fdb_file_handle **)pcVar25,(char *)ppfVar11,
                     (fdb_config *)(apfStack_46b8 + 0x21));
    iVar3 = (int)ppfVar20;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar20 = (fdb_kvs_handle **)0x0;
    ppfStack_4738 = ppfVar27;
    pfStack_4730 = pfVar17;
    do {
      ppfVar27 = ppfVar20;
      pcStack_4740 = (code *)0x11c35b;
      sprintf((char *)ppfVar11,"kvs%d",(ulong)(uint)((int)ppfVar27 + (int)uVar21));
      pfVar30 = *(fdb_kvs_handle **)pcVar25;
      pcStack_4740 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar30,(fdb_kvs_handle **)pfVar17,(char *)ppfVar11,
                           (fdb_kvs_config *)(apfStack_4728 + 9));
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_4740 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).custom_cmp;
      ppfVar20 = (fdb_kvs_handle **)((long)ppfVar27 + 1);
    } while ((char *)((long)ppfVar27 + 1) != (char *)0x80);
    ppfVar27 = (fdb_kvs_handle **)((long)ppfStack_4738 + 1);
    uVar21 = uVar21 + 0x80;
    pfVar17 = (fdb_kvs_handle *)&pfStack_4730[1].bub_ctx.space_used;
  } while (ppfVar27 != (fdb_kvs_handle **)0x8);
  ppfVar27 = apfStack_46b8 + 0x40;
  ppfVar11 = apfStack_43b8;
  pfVar17 = (fdb_kvs_handle *)0x0;
  do {
    uVar21 = 0;
    do {
      pcStack_4740 = (code *)0x11c3cf;
      sprintf((char *)ppfVar27,"key%08d",uVar21);
      pcStack_4740 = (code *)0x11c3e2;
      sprintf((char *)ppfVar11,"value%08d",uVar21);
      pcVar28 = (char *)apfStack_43b8[(long)&pfVar17->op_stats];
      pcStack_4740 = (code *)0x11c3f2;
      sVar5 = strlen((char *)ppfVar27);
      pcVar25 = (char *)(sVar5 + 1);
      pcStack_4740 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar11);
      pcStack_4740 = (code *)0x11c413;
      pfVar30 = (fdb_kvs_handle *)pcVar28;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar28,ppfVar27,(size_t)pcVar25,ppfVar11,sVar5 + 1);
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar8 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar8;
    } while (uVar8 != 10);
    pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
  } while (pfVar17 != (fdb_kvs_handle *)0x400);
  pcVar25 = (char *)0x0;
  do {
    pfVar30 = apfStack_4728[(long)pcVar25];
    if (((ulong)pcVar25 & 1) == 0) {
      pcStack_4740 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar30,'\0');
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_4740 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar30,'\x01');
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar25 = (char *)((long)pcVar25 + 1);
  } while (pcVar25 != (char *)0x8);
  pcVar25 = "key%08d";
  ppfVar27 = apfStack_46b8 + 0x40;
  ppfVar11 = (fdb_kvs_handle **)0x0;
  do {
    uVar21 = 0;
    do {
      pcStack_4740 = (code *)0x11c488;
      sprintf((char *)ppfVar27,"key%08d",uVar21);
      pfVar17 = apfStack_43b8[(long)(ppfVar11 + 4)];
      pcStack_4740 = (code *)0x11c498;
      sVar5 = strlen((char *)ppfVar27);
      pcStack_4740 = (code *)0x11c4a7;
      pfVar30 = pfVar17;
      fVar2 = fdb_del_kv(pfVar17,ppfVar27,sVar5 + 1);
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar8 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar8;
    } while (uVar8 != 10);
    ppfVar11 = (fdb_kvs_handle **)((long)ppfVar11 + 1);
  } while (ppfVar11 != (fdb_kvs_handle **)0x400);
  pcVar25 = (char *)0x0;
  do {
    pfVar30 = apfStack_4728[(long)pcVar25];
    if (((ulong)pcVar25 & 1) == 0) {
      pcStack_4740 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar30,'\0');
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_4740 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar30,'\x01');
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar25 = (char *)((long)pcVar25 + 1);
  } while (pcVar25 != (char *)0x8);
  ppfVar27 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar25 = (char *)(apfStack_43b8 + 0x20);
  do {
    pcStack_4740 = (code *)0x11c515;
    ppfVar20 = (fdb_kvs_handle **)pcVar25;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar25,10);
    iVar3 = (int)ppfVar20;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    ppfVar27 = ppfVar27 + 8;
    pcVar25 = (char *)((long)pcVar25 + 0x200);
  } while (ppfVar27 < (fdb_kvs_handle **)0x3c0);
  ppfVar11 = apfStack_4728;
  pcVar25 = "kvs%d";
  ppfVar27 = apfStack_46b8;
  pfVar17 = (fdb_kvs_handle *)0x0;
  do {
    pfVar30 = apfStack_43b8[(long)&pfVar17->op_stats];
    pcStack_4740 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar30);
    iVar3 = (int)pfVar30;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_4740 = (code *)0x11c56d;
    sprintf((char *)ppfVar27,"kvs%d",(ulong)pfVar17 & 0xffffffff);
    pfVar30 = *ppfVar11;
    pcStack_4740 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar30,(char *)ppfVar27);
    iVar3 = (int)pfVar30;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar17 = (fdb_kvs_handle *)&(pfVar17->config).wal_threshold;
    ppfVar11 = ppfVar11 + 1;
  } while (pfVar17 != (fdb_kvs_handle *)0x400);
  pcVar25 = (char *)0x0;
  do {
    pfVar30 = apfStack_4728[(long)pcVar25];
    if (((ulong)pcVar25 & 1) == 0) {
      pcStack_4740 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar30,'\0');
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_4740 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar30,'\x01');
      iVar3 = (int)pfVar30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar25 = (char *)((long)pcVar25 + 1);
  } while (pcVar25 != (char *)0x8);
  pcVar25 = "mvcc_test_compact%d";
  ppfVar27 = apfStack_46b8;
  pfVar17 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_4740 = (code *)0x11c5eb;
    sprintf((char *)ppfVar27,"mvcc_test_compact%d",(ulong)pfVar17 & 0xffffffff);
    pfVar30 = apfStack_4728[(long)pfVar17];
    pcStack_4740 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar30,(char *)ppfVar27);
    iVar3 = (int)pfVar30;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
  } while (pfVar17 != (fdb_kvs_handle *)0x8);
  pcVar25 = (char *)0x0;
  pcStack_4740 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar30 = apfStack_4728[(long)pcVar25];
    pcStack_4740 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar30);
    iVar3 = (int)pfVar30;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar25 = (char *)((long)pcVar25 + 1);
    if (pcVar25 == (char *)0x8) {
      pcStack_4740 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_4740 = (code *)0x11c633;
      memleak_end();
      pcVar28 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      pcStack_4740 = (code *)0x11c664;
      fprintf(_stderr,pcVar28,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_4740 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_4740 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_4740 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_4740 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_4740 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_4740 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_4740 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_4c48 = (code *)0x11c6e3;
  ppfStack_4768 = (fdb_kvs_handle **)pcVar25;
  ppfStack_4760 = ppfVar11;
  pfStack_4758 = (fdb_kvs_handle *)pcVar28;
  ppfStack_4750 = ppfVar27;
  pfStack_4748 = pfVar17;
  pcStack_4740 = (code *)uVar21;
  gettimeofday(&tStack_4bc0,(__timezone_ptr_t)0x0);
  pcStack_4c48 = (code *)0x11c6e8;
  memleak_start();
  pcStack_4c48 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_4c48 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_4860.flags = 1;
  fStack_4860.block_reusing_threshold = 0;
  fStack_4860.seqtree_opt = 0;
  pcStack_4c48 = (code *)0x11c728;
  fStack_4860.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4c48 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_4c30,"./mvcc_test1",(fdb_config *)(acStack_4960 + 0x100));
  iStack_4c0c = iVar3;
  if (iVar3 == 0) {
    pcStack_4c48 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_4c30,apfStack_4c00,&fStack_4be0);
    pcVar28 = (char *)0x1;
  }
  else {
    ppfVar11 = apfStack_4c00;
    uVar21 = 0;
    do {
      pcStack_4c48 = (code *)0x11c76d;
      sprintf(acStack_4bc8,"kv%d",uVar21 & 0xffffffff);
      pcStack_4c48 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_4c30,ppfVar11,acStack_4bc8,&fStack_4be0);
      uVar21 = uVar21 + 1;
      ppfVar11 = ppfVar11 + 1;
    } while (uVar21 != 3);
    pcVar28 = (char *)0x3;
  }
  uStack_4c34 = 0;
  do {
    uVar21 = 0;
    do {
      pcStack_4c48 = (code *)0x11c7d4;
      sprintf(acStack_4a60,"key%d",uVar21 & 0xffffffff);
      pcStack_4c48 = (code *)0x11c7f5;
      sprintf(acStack_4bb0,"meta-%d-%d",(ulong)uStack_4c34,uVar21 & 0xffffffff);
      pcStack_4c48 = (code *)0x11c814;
      sprintf(acStack_4960,"body-%d-%d",(ulong)uStack_4c34,uVar21 & 0xffffffff);
      doc = (btree *)(&bStack_4ab0.ksize + uVar21 * 8);
      pcStack_4c48 = (code *)0x11c827;
      sVar5 = strlen(acStack_4a60);
      pcStack_4c48 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_4bb0);
      pcStack_4c48 = (code *)0x11c842;
      sVar6 = strlen(acStack_4960);
      pcStack_4c48 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_4a60,sVar5,acStack_4bb0,metalen._M_i,acStack_4960,sVar6
                    );
      pfVar17 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_4c48 = (code *)0x11c878;
        fdb_set(apfStack_4c00[(long)pfVar17],*(fdb_doc **)doc);
        pfVar17 = (fdb_kvs_handle *)((long)pfVar17 + 1);
      } while ((fdb_kvs_handle *)pcVar28 != pfVar17);
      pcStack_4c48 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_4ab0.ksize + uVar21 * 8));
      uVar21 = uVar21 + 1;
    } while (uVar21 != 10);
    pcStack_4c48 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_4c30,~(byte)uStack_4c34 & 1);
    uStack_4c34 = uStack_4c34 + 1;
    pcVar25 = (char *)(ulong)uStack_4c34;
  } while (uStack_4c34 != 5);
  pcStack_4c48 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_4c30,&pfStack_4c18,&uStack_4be8);
  pfVar30 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4c48 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_4c00,(pfStack_4c18[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_4c28 = (fdb_kvs_handle *)0x0;
    pcVar25 = acStack_4960;
    pfVar30 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_4c48 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_4c00[(long)pfVar30],&pfStack_4c08,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_4c48 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_4c48 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_4c48 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_4c48 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_4c48 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_4c08,&pfStack_4c20,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_4c48 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_4c48 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_4c20,(fdb_doc **)&pfStack_4c28);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_4c48 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_4c48 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_4c48 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_4c48 = (code *)0x11c98b;
        sprintf(acStack_4a60,"key%d",metalen._M_i);
        if (pfVar30 == (fdb_kvs_handle *)0x0) {
          pcStack_4c48 = (code *)0x11c9da;
          sprintf(acStack_4bb0,"meta-1-%d",metalen._M_i);
          pcStack_4c48 = (code *)0x11c9ee;
          sprintf(pcVar25,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_4c48 = (code *)0x11c9ae;
          sprintf(acStack_4bb0,"meta-%d-%d",4,metalen._M_i);
          pcStack_4c48 = (code *)0x11c9c7;
          sprintf(pcVar25,"body-%d-%d",4);
        }
        pfVar17 = pfStack_4c28;
        doc = (btree *)pfStack_4c28->op_stats;
        pcStack_4c48 = (code *)0x11ca0a;
        iVar3 = bcmp(doc,acStack_4a60,*(size_t *)&pfStack_4c28->kvs_config);
        if (iVar3 != 0) {
          pcStack_4c48 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar17->staletree;
        pcStack_4c48 = (code *)0x11ca2a;
        iVar3 = bcmp(doc,acStack_4bb0,(size_t)(pfVar17->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cba4;
        doc = (pfVar17->field_6).seqtree;
        pcStack_4c48 = (code *)0x11ca45;
        iVar3 = bcmp(doc,pcVar25,(size_t)(pfVar17->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011cb94;
        pcStack_4c48 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar17);
        pfStack_4c28 = (fdb_kvs_handle *)0x0;
        uVar8 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar8;
        pcStack_4c48 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_4c20);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar8 != 10) goto LAB_0011cbbe;
      pcStack_4c48 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_4c20);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_4c48 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_4c08);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar30 = (fdb_kvs_handle *)&(pfVar30->kvs_config).field_0x1;
    } while (pfVar30 != (fdb_kvs_handle *)pcVar28);
    pcVar25 = (char *)0x0;
    do {
      pcStack_4c48 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_4c00[(long)pcVar25]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar25 = pcVar25 + 1;
    } while (pcVar28 != pcVar25);
    pcStack_4c48 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_4c30,pfStack_4c18[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_4c48 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_4c18,uStack_4be8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_4c48 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_4c30);
      pcStack_4c48 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_4c48 = (code *)0x11cb10;
      memleak_end();
      pcVar28 = "single kv mode:";
      if ((char)iStack_4c0c != '\0') {
        pcVar28 = "multiple kv mode:";
      }
      pcStack_4c48 = (code *)0x11cb40;
      sprintf(acStack_4960,"rollback without seqtree in %s",pcVar28);
      pcVar28 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar28 = "%s FAILED\n";
      }
      pcStack_4c48 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar28,acStack_4960);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_4c48 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_4c48 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_4c48 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_4c48 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_4e20 = (fdb_kvs_handle *)0x11cc03;
  pcStack_4c70 = pcVar25;
  aStack_4c68.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_4c60 = doc;
  pfStack_4c58 = pfVar17;
  pfStack_4c50 = pfVar30;
  pcStack_4c48 = (code *)pcVar28;
  gettimeofday(&tStack_4dc0,(__timezone_ptr_t)0x0);
  pfStack_4e20 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_4e20 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar28 = auStack_4db0 + 0x48;
  pfStack_4e20 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_4e20 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_4e18,"./mvcc_test2",(fdb_config *)pcVar28);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar28 = auStack_4db0;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_4dc8 = (btreeblk_handle *)auStack_4db0._16_8_;
    pfStack_4dd8 = (filemgr *)auStack_4db0._0_8_;
    pdStack_4dd0 = (docio_handle *)auStack_4db0._8_8_;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_4e18,&pfStack_4e10,(fdb_kvs_config *)&pfStack_4dd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_4e18,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar28 = "key%d";
    pfVar17 = (fdb_kvs_handle *)acStack_4e07;
    pfVar30 = (fdb_kvs_handle *)0x1565bd;
    uVar21 = 0;
    do {
      pfStack_4e20 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar17,"key%d",uVar21);
      handle = pfStack_4e10;
      pfStack_4e20 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar17);
      pfStack_4e20 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(handle,pfVar17,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4e20 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar8 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar8;
    } while (uVar8 != 10);
    pfStack_4e20 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_4e18,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_4e18,"./mvcc_test3");
    pfStack_4e20 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_4e18,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar28 = "key%d";
    pfVar17 = (fdb_kvs_handle *)acStack_4e07;
    uVar8 = 0;
    do {
      pfStack_4e20 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar17,"key%d",(ulong)uVar8);
      pfVar30 = pfStack_4e10;
      pfStack_4e20 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar17);
      pfStack_4e20 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar30,pfVar17,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    pfStack_4e20 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_4e18,(fdb_file_info *)auStack_4db0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar28 = (char *)((ulong)auStack_4db0._40_8_ / (ulong)uStack_4d64);
    pfStack_4e20 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_4e18);
    pfStack_4e20 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_4e20 = (fdb_kvs_handle *)0x11cdbe;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_4d64 * (long)pcVar28,
                       (ulong)((uStack_4d64 >> 2) + uStack_4d64 * 2));
    if (iVar3 < 0) goto LAB_0011cf90;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cde8;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar28 * 4 + 8) * (ulong)uStack_4d64,
                       (ulong)(uStack_4d64 >> 2));
    if (iVar3 < 0) goto LAB_0011cf95;
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_4e18,"./mvcc_test3",(fdb_config *)(auStack_4db0 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar28 = (char *)&pfStack_4df8;
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_4dc8 = pbStack_4de8;
    pfStack_4dd8 = pfStack_4df8;
    pdStack_4dd0 = pdStack_4df0;
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_4e18,&pfStack_4e10,(fdb_kvs_config *)&pfStack_4dd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_4e18,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar8 = 0;
      do {
        pfStack_4e20 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_4e07,"key%d",(ulong)uVar8);
        pfVar30 = pfStack_4e10;
        pfStack_4e20 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_4e07);
        pfStack_4e20 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar30,acStack_4e07,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 10);
      pfStack_4e20 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_4e18);
      pfVar30 = (fdb_kvs_handle *)&pfStack_4df8;
      uVar8 = 0;
      while( true ) {
        pfStack_4e20 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_4e07,"key%d",(ulong)uVar8);
        pfVar17 = pfStack_4e10;
        pfStack_4e20 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_4e07);
        pfStack_4e20 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar17,acStack_4e07,sVar5,(void **)pfVar30,&sStack_4de0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_4e20 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_4df8);
        uVar8 = uVar8 + 1;
        if (uVar8 == 10) {
          pfStack_4e20 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_4e18);
          pfStack_4e20 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_4e20 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar28 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar28 = "%s FAILED\n";
          }
          pfStack_4e20 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar28,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar17 = (fdb_kvs_handle *)acStack_4e07;
      pcVar28 = "key%d";
      pfStack_4e20 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_4e20 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_4e20 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_4e30 = (fdb_config *)pcVar28;
  pfStack_4e28 = pfVar17;
  pfStack_4e20 = pfVar30;
  gettimeofday(&tStack_4f50,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_4f60 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_4f70,"./mvcc_test1",&fStack_4f28);
  fdb_kvs_open_default(pfStack_4f70,&pfStack_4f58,&fStack_4f40);
  fdb_kvs_open(pfStack_4f70,&pfStack_4f78,"kv",&fStack_4f40);
  fVar2 = fdb_set_kv(pfStack_4f78,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_4f78,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_4f70,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_4f78,&pfStack_4f80,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_4f80,&pfStack_4f68,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_4f80);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_4f78);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_4f70,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_4f68,&pfStack_4f60);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_4f60);
    fVar2 = fdb_iterator_close(pfStack_4f68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_4f80);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_4f58);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_4f70);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar28 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar28 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar28,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_to_zero_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_zero_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    if (!multi_kv) {
        status = fdb_rollback(&db[0], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[0], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_set(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        for (r = 0; r < num_kvs; ++r) {
            status = fdb_rollback(&db[r], 0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_info(db[r], &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == 0);
            TEST_CHK(info.doc_count == 0);
            TEST_CHK(info.space_used == 0);
            status = fdb_get(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            // test normal operation after rollback
            status = fdb_set(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to zero test %s", multi_kv ? "multiple kv mode:"
                                                          : "single kv mode:");
    TEST_RESULT(bodybuf);
}